

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMacroCommand.cxx
# Opt level: O2

bool __thiscall
cmMacroCommand::InitialPass
          (cmMacroCommand *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args,cmExecutionStatus *param_2)

{
  pointer pbVar1;
  pointer pbVar2;
  cmMacroFunctionBlocker *this_00;
  allocator<char> local_49;
  string local_48;
  
  pbVar1 = (args->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  pbVar2 = (args->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  if (pbVar1 == pbVar2) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_48,"called with incorrect number of arguments",&local_49);
    cmCommand::SetError(&this->super_cmCommand,&local_48);
    std::__cxx11::string::~string((string *)&local_48);
  }
  else {
    this_00 = (cmMacroFunctionBlocker *)operator_new(0x88);
    memset(this_00,0,0x88);
    cmMacroFunctionBlocker::cmMacroFunctionBlocker(this_00);
    cmAppend<std::__cxx11::string,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
              (&this_00->Args,args);
    cmMakefile::AddFunctionBlocker((this->super_cmCommand).Makefile,(cmFunctionBlocker *)this_00);
  }
  return pbVar1 != pbVar2;
}

Assistant:

bool cmMacroCommand::InitialPass(std::vector<std::string> const& args,
                                 cmExecutionStatus&)
{
  if (args.empty()) {
    this->SetError("called with incorrect number of arguments");
    return false;
  }

  // create a function blocker
  cmMacroFunctionBlocker* f = new cmMacroFunctionBlocker();
  cmAppend(f->Args, args);
  this->Makefile->AddFunctionBlocker(f);
  return true;
}